

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O2

void __thiscall cppcms::http::impl::file_buffer::~file_buffer(file_buffer *this)

{
  *(undefined ***)this = &PTR__file_buffer_002b43b8;
  if ((FILE *)this->f_ != (FILE *)0x0) {
    fclose((FILE *)this->f_);
  }
  std::__cxx11::string::~string((string *)&this->name_);
  std::__cxx11::string::~string((string *)&this->temp_dir_);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->data_).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->output_).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->input_).super__Vector_base<char,_std::allocator<char>_>);
  std::streambuf::~streambuf(this);
  return;
}

Assistant:

~file_buffer()
	{
		if(f_)
			fclose(f_);
	}